

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O3

void __thiscall
SplitCompilationTest_empty_list_Test<char32_t>::TestBody
          (SplitCompilationTest_empty_list_Test<char32_t> *this)

{
  list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  split_result;
  AssertHelper aAStack_68 [8];
  long *local_60;
  char local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  long *local_48 [2];
  long local_38 [2];
  _List_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_28;
  
  jessilib::split<std::__cxx11::list,_const_char32_t_*,_const_char32_t_*,_char32_t>
            ((container_type_conflict33 *)&local_28,(char32_t *)0x0,(char32_t *)0x0,L'\0');
  local_58[0] = local_28._M_impl._M_node.super__List_node_base._M_next ==
                (_List_node_base *)&local_28;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58[0]) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_48,local_58,"split_result.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x5d,(char *)local_48[0]);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_clear(&local_28);
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_list) {
	std::basic_string_view<TypeParam> empty;
	std::list<std::basic_string<TypeParam>> split_result = split<std::list>(empty, default_delim<TypeParam>);
	EXPECT_TRUE(split_result.empty());
}